

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::rpc::Return::Builder::initException(Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder local_28;
  
  *(undefined2 *)((long)(this->_builder).data + 6) = 1;
  local_28.pointer = (this->_builder).pointers;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::initStruct
            (&__return_storage_ptr__->_builder,&local_28,(StructSize)0x10001);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::rpc::Exception::Builder Return::Builder::initException() {
  _builder.setDataField<Return::Which>(
      ::capnp::bounded<3>() * ::capnp::ELEMENTS, Return::EXCEPTION);
  return ::capnp::_::PointerHelpers< ::capnp::rpc::Exception>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS));
}